

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Snes_Spc.cpp
# Opt level: O2

blargg_err_t __thiscall Snes_Spc::load_spc(Snes_Spc *this,void *data,long size)

{
  uint uVar1;
  undefined1 auVar2 [13];
  undefined7 uVar3;
  undefined1 auVar4 [13];
  int iVar5;
  char *pcVar6;
  undefined1 auVar7 [16];
  undefined1 uVar8;
  ushort uVar9;
  undefined1 uVar10;
  undefined7 uVar11;
  
  pcVar6 = "Not an SPC file";
  if (0x22 < size) {
    iVar5 = bcmp(data,"SNES-SPC700 Sound File Data v0.30\x1a\x1a",0x1b);
    if (iVar5 == 0) {
      if ((ulong)size < 0x10180) {
        pcVar6 = "Corrupt SPC file";
      }
      else {
        (this->m).cpu_regs.pc = (uint)*(ushort *)((long)data + 0x25);
        uVar1 = *(uint *)((long)data + 0x27);
        auVar2[0xc] = (char)(uVar1 >> 0x18);
        auVar2._0_12_ = ZEXT712(0);
        auVar4[1] = 0;
        auVar4[0] = (byte)(uVar1 >> 0x10);
        auVar4._2_3_ = auVar2._10_3_;
        auVar4._5_8_ = 0;
        uVar10 = 0;
        uVar8 = (byte)(uVar1 >> 8);
        uVar9 = CONCAT11(uVar10,uVar8);
        uVar3 = SUB137(auVar4 << 0x40,6);
        uVar11 = uVar3;
        auVar7._4_9_ = CONCAT72(uVar11,uVar9);
        auVar7._0_4_ = uVar1 & 0xff;
        auVar7._13_3_ = 0;
        (this->m).cpu_regs.a = auVar7._0_4_;
        (this->m).cpu_regs.x = (int)auVar7._4_9_;
        (this->m).cpu_regs.y = (int)((uint7)uVar3 >> 0x10);
        (this->m).cpu_regs.psw = auVar7._12_4_;
        (this->m).cpu_regs.sp = (uint)*(byte *)((long)data + 0x2b);
        memcpy((this->m).ram.ram,(void *)((long)data + 0x100),0x10000);
        ram_loaded(this);
        Spc_Dsp::load(&this->dsp,(uint8_t *)((long)data + 0x10100));
        reset_time_regs(this);
        pcVar6 = (blargg_err_t)0x0;
      }
    }
  }
  return pcVar6;
}

Assistant:

blargg_err_t Snes_Spc::load_spc( void const* data, long size )
{
	spc_file_t const* const spc = (spc_file_t const*) data;
	
	// be sure compiler didn't insert any padding into fle_t
	assert( sizeof (spc_file_t) == spc_min_file_size + 0x80 );
	
	// Check signature and file size
	if ( size < signature_size || memcmp( spc, signature, 27 ) )
		return "Not an SPC file";
	
	if ( size < spc_min_file_size )
		return "Corrupt SPC file";
	
	// CPU registers
	m.cpu_regs.pc  = spc->pch * 0x100 + spc->pcl;
	m.cpu_regs.a   = spc->a;
	m.cpu_regs.x   = spc->x;
	m.cpu_regs.y   = spc->y;
	m.cpu_regs.psw = spc->psw;
	m.cpu_regs.sp  = spc->sp;
	
	// RAM and registers
	memcpy( RAM, spc->ram, 0x10000 );
	ram_loaded();
	
	// DSP registers
	dsp.load( spc->dsp );
	
	reset_time_regs();
	
	return 0;
}